

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::TestCaseTracking::ITracker> * __thiscall
Catch::Ptr<Catch::TestCaseTracking::ITracker>::operator=
          (Ptr<Catch::TestCaseTracking::ITracker> *this,ITracker *p)

{
  ITracker *in_RDI;
  Ptr<Catch::TestCaseTracking::ITracker> temp;
  Ptr<Catch::TestCaseTracking::ITracker> *this_00;
  Ptr<Catch::TestCaseTracking::ITracker> local_18 [3];
  
  this_00 = local_18;
  Ptr(this_00,in_RDI);
  swap(this_00,(Ptr<Catch::TestCaseTracking::ITracker> *)in_RDI);
  ~Ptr(this_00);
  return (Ptr<Catch::TestCaseTracking::ITracker> *)in_RDI;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }